

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O1

string * __thiscall Klex::parseOutNumber_abi_cxx11_(string *__return_storage_ptr__,Klex *this)

{
  bool bVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->charClass == DIGIT) {
    bVar1 = false;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      nextChar(this);
      if (this->currentChar == 0x2e) {
        if (bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        nextChar(this);
        bVar1 = true;
      }
    } while (this->charClass == DIGIT);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutNumber() {
    std::string lexeme;
    bool onePoint = false;

    while(getCharClass() == CharClass::DIGIT) {
        lexeme += getChar();
        nextChar();

        if(getChar() == '.') {
            if(onePoint)
                break;

            onePoint = true;
            lexeme.push_back(getChar());
            nextChar();
        }
    }

    return lexeme;
}